

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

int __thiscall CTcSymMetaclassBase::write_to_sym_file(CTcSymMetaclassBase *this,CVmFile *fp)

{
  char *__s;
  size_t buflen;
  
  CTcSymbolBase::write_to_file_gen((CTcSymbolBase *)this,fp);
  __s = CTcGenTarg::get_meta_name(G_cg,this->meta_idx_);
  buflen = strlen(__s);
  CVmFile::write_byte(fp,(char)buflen);
  CVmFile::write_bytes(fp,__s,buflen);
  return 1;
}

Assistant:

int CTcSymMetaclassBase::write_to_sym_file(class CVmFile *fp)
{
    /* inherit the base class handling to write the symbol */
    CTcSymbol::write_to_sym_file(fp);

    /* add the metaclass ID string */
    const char *id = G_cg->get_meta_name(meta_idx_);
    size_t idlen = strlen(id);
    fp->write_byte((char)idlen);
    fp->write_bytes(id, idlen);

    /* success */
    return TRUE; 
}